

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O1

RTPTime __thiscall jrtplib::RTPSourceData::INF_GetRoundtripTime(RTPSourceData *this)

{
  double dVar1;
  uint32_t uVar2;
  ulong uVar3;
  RTPTime RVar4;
  
  RVar4.m_t = 0.0;
  if (((this->RRinf).hasinfo == true) &&
     (uVar2 = (this->RRinf).dlsr, (this->RRinf).lsr != 0 || uVar2 != 0)) {
    dVar1 = (this->RRinf).receivetime.m_t;
    uVar3 = (ulong)dVar1;
    RVar4.m_t = (double)(((uint)(long)(((double)((long)((dVar1 - (double)(uVar3 & 0xffffffff)) *
                                                       1000000.0) & 0xffffffff) / 1000000.0) *
                                      4294967296.0) >> 0x10 | ((int)uVar3 + 0x7e80) * 0x10000) -
                        (uVar2 + (this->RRinf).lsr)) * 1.52587890625e-05;
  }
  return (RTPTime)RVar4.m_t;
}

Assistant:

RTPTime RTPSourceData::INF_GetRoundtripTime() const
{
	if (!RRinf.HasInfo())
		return RTPTime(0,0);
	if (RRinf.GetDelaySinceLastSR() == 0 && RRinf.GetLastSRTimestamp() == 0)
		return RTPTime(0,0);

	RTPNTPTime recvtime = RRinf.GetReceiveTime().GetNTPTime();
	uint32_t rtt = ((recvtime.GetMSW()&0xFFFF)<<16)|((recvtime.GetLSW()>>16)&0xFFFF);
	rtt -= RRinf.GetLastSRTimestamp();
	rtt -= RRinf.GetDelaySinceLastSR();

	double drtt = (((double)rtt)/65536.0);
	return RTPTime(drtt);
}